

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.hpp
# Opt level: O0

bool Diligent::PRSSerializer<(Diligent::SerializerMode)1>::
     SerializeInternalData<Diligent::PipelineResourceSignatureInternalDataGL>
               (Serializer<(Diligent::SerializerMode)1> *Ser,
               ConstQual<Diligent::PipelineResourceSignatureInternalDataGL> *InternalData,
               DynamicLinearAllocator *Allocator)

{
  bool bVar1;
  DynamicLinearAllocator *Allocator_local;
  ConstQual<Diligent::PipelineResourceSignatureInternalDataGL> *InternalData_local;
  Serializer<(Diligent::SerializerMode)1> *Ser_local;
  
  bVar1 = Serializer<(Diligent::SerializerMode)1>::operator()
                    (Ser,(SHADER_TYPE *)InternalData,
                     &(InternalData->
                      super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsGL,_Diligent::ImmutableSamplerAttribsGL>
                      ).StaticResShaderStages,
                     &(InternalData->
                      super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsGL,_Diligent::ImmutableSamplerAttribsGL>
                      ).PipelineType,
                     &(InternalData->
                      super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsGL,_Diligent::ImmutableSamplerAttribsGL>
                      ).StaticResStageIndex);
  if (bVar1) {
    bVar1 = Serializer<(Diligent::SerializerMode)1>::
            SerializeArrayRaw<Diligent::PipelineResourceAttribsGL_const*const,unsigned_int_const>
                      (Ser,Allocator,
                       &(InternalData->
                        super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsGL,_Diligent::ImmutableSamplerAttribsGL>
                        ).pResourceAttribs,
                       &(InternalData->
                        super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsGL,_Diligent::ImmutableSamplerAttribsGL>
                        ).NumResources);
    if (bVar1) {
      bVar1 = Serializer<(Diligent::SerializerMode)1>::
              SerializeArrayRaw<Diligent::ImmutableSamplerAttribsGL_const*const,unsigned_int_const>
                        (Ser,Allocator,
                         &(InternalData->
                          super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsGL,_Diligent::ImmutableSamplerAttribsGL>
                          ).pImmutableSamplers,
                         &(InternalData->
                          super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsGL,_Diligent::ImmutableSamplerAttribsGL>
                          ).NumImmutableSamplers);
      if (bVar1) {
        Ser_local._7_1_ = true;
      }
      else {
        Ser_local._7_1_ = false;
      }
    }
    else {
      Ser_local._7_1_ = false;
    }
  }
  else {
    Ser_local._7_1_ = false;
  }
  return Ser_local._7_1_;
}

Assistant:

static bool SerializeInternalData(Serializer<Mode>&                                     Ser,
                                      ConstQual<PipelineResourceSignatureInternalDataType>& InternalData,
                                      DynamicLinearAllocator*                               Allocator)
    {
        if (!Ser(InternalData.ShaderStages,
                 InternalData.StaticResShaderStages,
                 InternalData.PipelineType,
                 InternalData.StaticResStageIndex))
            return false;

        if (!Ser.SerializeArrayRaw(Allocator, InternalData.pResourceAttribs, InternalData.NumResources))
            return false;

        if (!Ser.SerializeArrayRaw(Allocator, InternalData.pImmutableSamplers, InternalData.NumImmutableSamplers))
            return false;

        return true;
    }